

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_allocator *alloc;
  bool bVar1;
  xml_node_struct *pxVar2;
  xml_allocator *shared_alloc;
  xml_node_struct *node;
  xml_node_struct *sn_00;
  
  if ((dn == (xml_node_struct *)0x0) || (sn == (xml_node_struct *)0x0)) {
    __assert_fail("object",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x486,
                  "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                 );
  }
  alloc = *(xml_allocator **)((long)dn - (dn->header >> 8));
  shared_alloc = (xml_allocator *)0x0;
  if (alloc == *(xml_allocator **)((long)sn - (sn->header >> 8))) {
    shared_alloc = alloc;
  }
  node_copy_contents(dn,sn,shared_alloc);
  sn_00 = sn->first_child;
  node = dn;
  if (sn_00 != sn && sn_00 != (xml_node_struct *)0x0) {
    do {
      if (sn_00 == dn) {
LAB_0011c9d5:
        do {
          pxVar2 = sn_00->next_sibling;
          if (sn_00->next_sibling != (xml_node_struct *)0x0) break;
          sn_00 = sn_00->parent;
          node = node->parent;
          pxVar2 = sn_00;
        } while (sn_00 != sn);
      }
      else {
        pxVar2 = append_new_node(node,alloc,
                                 (xml_node_type)sn_00->header & (node_doctype|node_declaration));
        if (pxVar2 == (xml_node_struct *)0x0) {
LAB_0011c9cf:
          bVar1 = true;
        }
        else {
          node_copy_contents(pxVar2,sn_00,shared_alloc);
          if (sn_00->first_child == (xml_node_struct *)0x0) goto LAB_0011c9cf;
          bVar1 = false;
          node = pxVar2;
          sn_00 = sn_00->first_child;
        }
        pxVar2 = sn_00;
        if (bVar1) goto LAB_0011c9d5;
      }
    } while ((pxVar2 != (xml_node_struct *)0x0) && (sn_00 = pxVar2, pxVar2 != sn));
  }
  return;
}

Assistant:

inline xml_allocator& get_allocator(const Object* object)
	{
		assert(object);

		return *PUGI__GETPAGE(object)->allocator;
	}